

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

bool __thiscall FIX::Initiator::isPending(Initiator *this,SessionID *sessionID)

{
  iterator iVar1;
  
  Mutex::lock(&this->m_mutex);
  iVar1 = std::
          _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
          ::find(&(this->m_pending)._M_t,sessionID);
  Mutex::unlock(&this->m_mutex);
  return (_Rb_tree_header *)iVar1._M_node != &(this->m_pending)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool Initiator::isPending( const SessionID& sessionID )
{
  Locker l(m_mutex);
  return m_pending.find( sessionID ) != m_pending.end();
}